

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

string * __thiscall
smf::MidiMessage::getMetaContent_abi_cxx11_(string *__return_storage_ptr__,MidiMessage *this)

{
  pointer puVar1;
  bool bVar2;
  ulong uStack_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar2 = isMeta(this);
  if (bVar2) {
    puVar1 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((char)puVar1[2] < '\0') {
      if ((char)puVar1[3] < '\0') {
        if ((char)puVar1[4] < '\0') {
          uStack_20 = (ulong)(puVar1[5] >> 7) | 6;
        }
        else {
          uStack_20 = 5;
        }
      }
      else {
        uStack_20 = 4;
      }
    }
    else {
      uStack_20 = 3;
    }
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    for (; (long)uStack_20 <
           (long)(*(int *)&(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                 (int)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start); uStack_20 = uStack_20 + 1) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MidiMessage::getMetaContent(void) {
	std::string output;
	if (!isMetaMessage()) {
		return output;
	}
	int start = 3;
	if (operator[](2) > 0x7f) {
		start++;
		if (operator[](3) > 0x7f) {
			start++;
			if (operator[](4) > 0x7f) {
				start++;
				if (operator[](5) > 0x7f) {
					start++;
					// maximum of 5 bytes in VLV, so last must be < 0x80
				}
			}
		}
	}
	output.reserve(this->size());
	for (int i=start; i<(int)this->size(); i++) {
		output.push_back(operator[](i));
	}
	return output;
}